

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O3

gdImagePtr gdImageClone(gdImagePtr src)

{
  uint uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int *piVar4;
  int *piVar5;
  int iVar6;
  int iVar7;
  gdImagePtr im;
  long lVar8;
  gdImagePtr pgVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  
  if (src->trueColor == 0) {
    im = gdImageCreate(src->sx,src->sy);
  }
  else {
    im = gdImageCreateTrueColor(src->sx,src->sy);
  }
  if (im != (gdImagePtr)0x0) {
    if (src->trueColor == 0) {
      im->colorsTotal = src->colorsTotal;
      lVar8 = 0;
      do {
        im->red[lVar8] = src->red[lVar8];
        im->green[lVar8] = src->green[lVar8];
        im->blue[lVar8] = src->blue[lVar8];
        im->alpha[lVar8] = src->alpha[lVar8];
        im->open[lVar8] = src->open[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x100);
    }
    else {
      iVar11 = src->sy;
      if (0 < iVar11) {
        uVar10 = (ulong)(uint)src->sx;
        lVar8 = 0;
        do {
          if (0 < (int)uVar10) {
            piVar4 = src->tpixels[lVar8];
            piVar5 = im->tpixels[lVar8];
            lVar12 = 0;
            do {
              piVar5[lVar12] = piVar4[lVar12];
              lVar12 = lVar12 + 1;
              uVar10 = (ulong)src->sx;
            } while (lVar12 < (long)uVar10);
            iVar11 = src->sy;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < iVar11);
      }
    }
    if (0 < src->styleLength) {
      im->styleLength = src->styleLength;
      im->stylePos = src->stylePos;
      if (0 < src->styleLength) {
        piVar4 = src->style;
        piVar5 = im->style;
        lVar8 = 0;
        do {
          piVar5[lVar8] = piVar4[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 < src->styleLength);
      }
    }
    im->interlace = src->interlace;
    iVar11 = src->saveAlphaFlag;
    iVar6 = src->AA;
    iVar7 = src->AA_color;
    im->alphaBlendingFlag = src->alphaBlendingFlag;
    im->saveAlphaFlag = iVar11;
    im->AA = iVar6;
    im->AA_color = iVar7;
    iVar11 = src->cx1;
    iVar6 = src->cy1;
    iVar7 = src->cx2;
    im->AA_dont_blend = src->AA_dont_blend;
    im->cx1 = iVar11;
    im->cy1 = iVar6;
    im->cx2 = iVar7;
    im->cy2 = src->cy2;
    uVar2 = src->paletteQuantizationMethod;
    uVar3 = src->paletteQuantizationSpeed;
    uVar1 = src->res_x;
    im->res_x = uVar1;
    im->res_y = uVar1;
    im->paletteQuantizationMethod = uVar2;
    im->paletteQuantizationSpeed = uVar3;
    im->paletteQuantizationMinQuality = src->paletteQuantizationMinQuality;
    im->interpolation_id = src->interpolation_id;
    im->interpolation = src->interpolation;
    if (src->brush != (gdImagePtr)0x0) {
      pgVar9 = gdImageClone(src->brush);
      im->brush = pgVar9;
    }
    if (src->tile != (gdImagePtr)0x0) {
      pgVar9 = gdImageClone(src->tile);
      im->tile = pgVar9;
    }
    if (src->style != (int *)0x0) {
      gdImageSetStyle(im,src->style,src->styleLength);
    }
    lVar8 = -0x100;
    do {
      im->tileColorMap[lVar8] = src->tileColorMap[lVar8];
      im->alpha[lVar8 + -6] = src->alpha[lVar8 + -6];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0);
    if ((0 < src->polyAllocated) && (im->polyAllocated = src->polyAllocated, 0 < src->polyAllocated)
       ) {
      piVar4 = src->polyInts;
      piVar5 = im->polyInts;
      lVar8 = 0;
      do {
        piVar5[lVar8] = piVar4[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 < src->polyAllocated);
    }
  }
  return im;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageClone (gdImagePtr src) {
	gdImagePtr dst;
	register int i, x;

	if (src->trueColor) {
		dst = gdImageCreateTrueColor(src->sx , src->sy);
	} else {
		dst = gdImageCreate(src->sx , src->sy);
	}

	if (dst == NULL) {
		return NULL;
	}

	if (src->trueColor == 0) {
		dst->colorsTotal = src->colorsTotal;
		for (i = 0; i < gdMaxColors; i++) {
			dst->red[i]   = src->red[i];
			dst->green[i] = src->green[i];
			dst->blue[i]  = src->blue[i];
			dst->alpha[i] = src->alpha[i];
			dst->open[i]  = src->open[i];
		}
		for (i = 0; i < src->sy; i++) {
			for (x = 0; x < src->sx; x++) {
				dst->pixels[i][x] = dst->pixels[i][x];
			}
		}
	} else {
		for (i = 0; i < src->sy; i++) {
			for (x = 0; x < src->sx; x++) {
				dst->tpixels[i][x] = src->tpixels[i][x];
			}
		}
	}

	if (src->styleLength > 0) {
		dst->styleLength = src->styleLength;
		dst->stylePos    = src->stylePos;
		for (i = 0; i < src->styleLength; i++) {
			dst->style[i] = src->style[i];
		}
	}

	dst->interlace   = src->interlace;

	dst->alphaBlendingFlag = src->alphaBlendingFlag;
	dst->saveAlphaFlag     = src->saveAlphaFlag;
	dst->AA                = src->AA;
	dst->AA_color          = src->AA_color;
	dst->AA_dont_blend     = src->AA_dont_blend;

	dst->cx1 = src->cx1;
	dst->cy1 = src->cy1;
	dst->cx2 = src->cx2;
	dst->cy2 = src->cy2;

	dst->res_x = src->res_x;
	dst->res_y = src->res_x;

	dst->paletteQuantizationMethod     = src->paletteQuantizationMethod;
	dst->paletteQuantizationSpeed      = src->paletteQuantizationSpeed;
	dst->paletteQuantizationMinQuality = src->paletteQuantizationMinQuality;
	dst->paletteQuantizationMinQuality = src->paletteQuantizationMinQuality;

	dst->interpolation_id = src->interpolation_id;
	dst->interpolation    = src->interpolation;

	if (src->brush) {
		dst->brush = gdImageClone(src->brush);
	}

	if (src->tile) {
		dst->tile = gdImageClone(src->tile);
	}

	if (src->style) {
		gdImageSetStyle(dst, src->style, src->styleLength);
	}

	for (i = 0; i < gdMaxColors; i++) {
		dst->brushColorMap[i] = src->brushColorMap[i];
		dst->tileColorMap[i] = src->tileColorMap[i];
	}

	if (src->polyAllocated > 0) {
		dst->polyAllocated = src->polyAllocated;
		for (i = 0; i < src->polyAllocated; i++) {
			dst->polyInts[i] = src->polyInts[i];
		}
	}

	return dst;
}